

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkFindConflict(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues,int nFrames)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *__ptr;
  word *pwVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  Vec_Int_t *unaff_R13;
  ulong uVar18;
  ulong uVar19;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar8 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar8;
  if (vMemObjs->nSize * nFrames * 3 != vValues->nSize) {
    __assert_fail("3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                  ,0x357,
                  "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)");
  }
  uVar16 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar16) {
    piVar9 = (p->vCopies).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar16 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar16 << 2);
    }
    (p->vCopies).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar16;
  }
  if (0 < (int)uVar16) {
    memset((p->vCopies).pArray,0,(ulong)uVar16 * 4);
  }
  (p->vCopies).nSize = uVar16;
  if (0 < vMemObjs->nSize) {
    piVar9 = vMemObjs->pArray;
    lVar13 = 0;
    do {
      iVar7 = piVar9[lVar13];
      if (((long)iVar7 < 0) || ((p->vCopies).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar7] = (int)lVar13;
      lVar13 = lVar13 + 1;
    } while (lVar13 < vMemObjs->nSize);
  }
  if (0 < nFrames) {
    iVar7 = 0;
    do {
      if (0 < vMemObjs->nSize) {
        lVar13 = 0;
        do {
          lVar10 = (long)vMemObjs->pArray[lVar13];
          if ((lVar10 < 1) || (p->nObjsAlloc <= vMemObjs->pArray[lVar13])) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar10] & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x36) {
            unaff_R13 = Wlc_NtkTrace(p,p->pObjs + lVar10,iVar7,vMemObjs,vValues);
            iVar6 = Wlc_NtkTraceCheckConfict(p,unaff_R13,vMemObjs,vValues);
            if (iVar6 != 0) {
              iVar7 = p_00->nCap;
              if (0 < (long)iVar7) {
                pVVar8 = p_00->pArray;
                lVar13 = 0;
                do {
                  pvVar4 = *(void **)((long)&pVVar8->pArray + lVar13);
                  if (pvVar4 != (void *)0x0) {
                    free(pvVar4);
                    *(undefined8 *)((long)&pVVar8->pArray + lVar13) = 0;
                  }
                  lVar13 = lVar13 + 0x10;
                } while ((long)iVar7 * 0x10 != lVar13);
              }
              if (p_00->pArray != (Vec_Int_t *)0x0) {
                free(p_00->pArray);
                p_00->pArray = (Vec_Int_t *)0x0;
              }
              p_00->nCap = 0;
              p_00->nSize = 0;
              free(p_00);
              return unaff_R13;
            }
            Vec_WecPushLevel(p_00);
            iVar6 = p_00->nSize;
            if ((long)iVar6 < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            if (0 < unaff_R13->nSize) {
              pVVar8 = p_00->pArray;
              lVar10 = 0;
              do {
                Vec_IntPush(pVVar8 + (long)iVar6 + -1,unaff_R13->pArray[lVar10]);
                lVar10 = lVar10 + 1;
              } while (lVar10 < unaff_R13->nSize);
            }
            if (unaff_R13->pArray != (int *)0x0) {
              free(unaff_R13->pArray);
              unaff_R13->pArray = (int *)0x0;
            }
            if (unaff_R13 != (Vec_Int_t *)0x0) {
              free(unaff_R13);
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < vMemObjs->nSize);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != nFrames);
  }
  if (0 < p_00->nSize) {
    uVar18 = 0;
    do {
      iVar7 = (int)uVar18;
      if (iVar7 < 0) {
LAB_0033b1d6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (iVar7 != 0) {
        pVVar8 = p_00->pArray;
        lVar13 = 0;
        uVar19 = uVar18;
        do {
          if (p_00->nSize <= lVar13) goto LAB_0033b1d6;
          iVar7 = pVVar8[uVar18].nSize;
          if ((long)iVar7 < 1) {
LAB_0033b15a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          __ptr = p_00->pArray;
          if ((long)__ptr[lVar13].nSize < 1) goto LAB_0033b15a;
          piVar9 = pVVar8[uVar18].pArray;
          if (*piVar9 == *__ptr[lVar13].pArray) {
            uVar16 = piVar9[(long)iVar7 + -1] >> 0xb;
            if (((int)uVar16 < 0) || (iVar6 = (p->vCopies).nSize, iVar6 <= (int)uVar16))
            goto LAB_0033b15a;
            uVar17 = __ptr[lVar13].pArray[(long)__ptr[lVar13].nSize + -1];
            uVar15 = (int)uVar17 >> 0xb;
            if (((int)uVar15 < 0) || (iVar6 <= (int)uVar15)) goto LAB_0033b15a;
            piVar11 = (p->vCopies).pArray;
            uVar1 = piVar11[uVar16];
            if (((int)uVar1 < 0) || (iVar6 = vMemObjs->nSize, iVar6 <= (int)uVar1))
            goto LAB_0033b15a;
            if (uVar16 != vMemObjs->pArray[uVar1]) {
              __assert_fail("iObj1 == Vec_IntEntry(vMemObjs, iNum1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                            ,0x37b,
                            "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                           );
            }
            uVar16 = piVar11[uVar15];
            if (((int)uVar16 < 0) || (iVar6 <= (int)uVar16)) goto LAB_0033b15a;
            if (uVar15 != vMemObjs->pArray[uVar16]) {
              __assert_fail("iObj2 == Vec_IntEntry(vMemObjs, iNum2)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                            ,0x37c,
                            "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                           );
            }
            iVar12 = ((uint)piVar9[(long)iVar7 + -1] >> 1 & 0x3ff) * iVar6 + uVar1;
            if (iVar12 < 0) {
LAB_0033b198:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                            ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
            }
            iVar12 = iVar12 * 3;
            uVar15 = iVar12 + 1;
            iVar2 = vValues->nSize;
            if ((iVar2 <= (int)uVar15) ||
               (iVar6 = (uVar17 >> 1 & 0x3ff) * iVar6 + uVar16, iVar6 < 0)) goto LAB_0033b198;
            uVar16 = iVar6 * 3 + 1;
            if (iVar2 <= (int)uVar16) goto LAB_0033b198;
            pwVar3 = vValues->pArray;
            bVar5 = true;
            if (pwVar3[uVar15] == pwVar3[uVar16]) {
              uVar16 = iVar12 + 2;
              if (((iVar2 <= (int)uVar16) || (iVar6 < 0)) ||
                 (uVar17 = iVar6 * 3 + 2, iVar2 <= (int)uVar17)) goto LAB_0033b198;
              if (pwVar3[uVar16] != pwVar3[uVar17]) {
                unaff_R13 = (Vec_Int_t *)malloc(0x10);
                unaff_R13->nCap = 100;
                unaff_R13->nSize = 0;
                piVar11 = (int *)malloc(400);
                unaff_R13->pArray = piVar11;
                pVVar8[uVar18].nSize = iVar7 - 1U;
                Vec_IntPush(unaff_R13,piVar9[iVar7 - 1U]);
                if (1 < pVVar8[uVar18].nSize) {
                  lVar10 = 1;
                  do {
                    if (0 < (long)unaff_R13->nSize) {
                      lVar14 = 0;
                      do {
                        if (unaff_R13->pArray[lVar14] == pVVar8[uVar18].pArray[lVar10])
                        goto LAB_0033afd9;
                        lVar14 = lVar14 + 1;
                      } while (unaff_R13->nSize != lVar14);
                    }
                    Vec_IntPush(unaff_R13,pVVar8[uVar18].pArray[lVar10]);
LAB_0033afd9:
                    lVar10 = lVar10 + 1;
                  } while (lVar10 < pVVar8[uVar18].nSize);
                }
                uVar19 = 1;
                if (1 < __ptr[lVar13].nSize) {
                  uVar19 = 1;
                  do {
                    if (0 < (long)unaff_R13->nSize) {
                      lVar10 = 0;
                      do {
                        if (unaff_R13->pArray[lVar10] == __ptr[lVar13].pArray[uVar19])
                        goto LAB_0033b023;
                        lVar10 = lVar10 + 1;
                      } while (unaff_R13->nSize != lVar10);
                    }
                    Vec_IntPush(unaff_R13,__ptr[lVar13].pArray[uVar19]);
LAB_0033b023:
                    uVar19 = uVar19 + 1;
                  } while ((long)uVar19 < (long)__ptr[lVar13].nSize);
                }
                iVar7 = p_00->nCap;
                if (0 < (long)iVar7) {
                  lVar10 = 0;
                  do {
                    pvVar4 = *(void **)((long)&__ptr->pArray + lVar10);
                    if (pvVar4 != (void *)0x0) {
                      free(pvVar4);
                      *(undefined8 *)((long)&__ptr->pArray + lVar10) = 0;
                    }
                    lVar10 = lVar10 + 0x10;
                  } while ((long)iVar7 * 0x10 != lVar10);
                }
                if (__ptr != (Vec_Int_t *)0x0) {
                  free(__ptr);
                  p_00->pArray = (Vec_Int_t *)0x0;
                }
                p_00->nCap = 0;
                p_00->nSize = 0;
                free(p_00);
                bVar5 = false;
              }
            }
            if (!bVar5) {
              return unaff_R13;
            }
          }
          lVar13 = lVar13 + 1;
          iVar7 = (int)uVar19;
        } while (lVar13 < iVar7);
      }
      uVar18 = (ulong)(iVar7 + 1U);
    } while ((int)(iVar7 + 1U) < p_00->nSize);
  }
  Vec_WecFree(p_00);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Wlc_NtkFindConflict( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, int nFrames )
{
    Wlc_Obj_t * pObj; int i, f, Entry;
    Vec_Wec_t * vTraces = Vec_WecAlloc( 100 );
    Vec_Int_t * vTrace, * vTrace1, * vTrace2;
    assert( 3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues) );
    Wlc_NtkCleanCopy( p );
    Vec_IntForEachEntry( vMemObjs, Entry, i )
        Wlc_ObjSetCopy( p, Entry, i );
    for ( f = 0; f < nFrames; f++ )
    {
        Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
        {
            if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
                continue;
            vTrace = Wlc_NtkTrace( p, pObj, f, vMemObjs, vValues );
            if ( Wlc_NtkTraceCheckConfict( p, vTrace, vMemObjs, vValues ) )
            {
                Vec_WecFree( vTraces );
                return vTrace;
            }
            Vec_WecPushLevel( vTraces );
            Vec_IntAppend( Vec_WecEntryLast(vTraces), vTrace );
            Vec_IntFree( vTrace );
        }
    }
    // check if there are any common read addresses
    Vec_WecForEachLevel( vTraces, vTrace1, i )
    Vec_WecForEachLevelStop( vTraces, vTrace2, f, i )
        if ( Vec_IntEntry(vTrace1, 0) == Vec_IntEntry(vTrace2, 0) )
        {
            int iObj1 = Vec_IntEntryLast(vTrace1) >> 11;
            int iFrm1 =(Vec_IntEntryLast(vTrace1) >> 1) & 0x3FF;
            int iNum1 = Wlc_ObjCopy( p, iObj1 );
            int iInd1 = 3*(iFrm1*Vec_IntSize(vMemObjs) + iNum1);

            int iObj2 = Vec_IntEntryLast(vTrace2) >> 11;
            int iFrm2 =(Vec_IntEntryLast(vTrace2) >> 1) & 0x3FF;
            int iNum2 = Wlc_ObjCopy( p, iObj2 );
            int iInd2 = 3*(iFrm2*Vec_IntSize(vMemObjs) + iNum2);

            assert( iObj1 == Vec_IntEntry(vMemObjs, iNum1) );
            assert( iObj2 == Vec_IntEntry(vMemObjs, iNum2) );
            if ( Vec_WrdEntry(vValues, iInd1 + 1) == Vec_WrdEntry(vValues, iInd2 + 1) &&  // equal address
                 Vec_WrdEntry(vValues, iInd1 + 2) != Vec_WrdEntry(vValues, iInd2 + 2) )   // diff data
            {
                vTrace = Vec_IntAlloc( 100 );
                Vec_IntPush( vTrace, Vec_IntPop(vTrace1) );
                Vec_IntForEachEntryStart( vTrace1, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_IntForEachEntryStart( vTrace2, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_WecFree( vTraces );
                return vTrace;
            }
        }
    Vec_WecFree( vTraces );
    return NULL;
}